

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

void do_init_context(sexp_conflict *ctx,sexp_conflict *env,sexp_uint_t heap_size,
                    sexp_uint_t heap_max_size,sexp_sint_t fold_case)

{
  sexp_conflict psVar1;
  
  psVar1 = (sexp_conflict)sexp_make_eval_context(0,0,0,heap_size,heap_max_size);
  *ctx = psVar1;
  if (psVar1 != (sexp_conflict)0x0) {
    (((psVar1->value).type.setters)->value).context.mark_stack[6].prev =
         (sexp_mark_stack_ptr_t *)((ulong)(fold_case != 0) << 8 | 0x3e);
    *env = ((*ctx)->value).type.cpl;
    return;
  }
  fwrite("chibi-scheme: out of memory\n",0x1c,1,_stderr);
  exit(0x46);
}

Assistant:

static void do_init_context (sexp* ctx, sexp* env, sexp_uint_t heap_size,
                             sexp_uint_t heap_max_size, sexp_sint_t fold_case) {
  *ctx = sexp_make_eval_context(NULL, NULL, NULL, heap_size, heap_max_size);
  if (! *ctx) {
    fprintf(stderr, "chibi-scheme: out of memory\n");
    exit_failure();
  }
#if SEXP_USE_FOLD_CASE_SYMS
  sexp_global(*ctx, SEXP_G_FOLD_CASE_P) = sexp_make_boolean(fold_case);
#endif
  *env = sexp_context_env(*ctx);
}